

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

Shader LoadShader(char *vsFileName,char *fsFileName)

{
  int i;
  int iVar1;
  int *piVar2;
  long lVar3;
  char *vsCode;
  char *fsCode;
  Shader SVar4;
  
  piVar2 = (int *)calloc(0x20,4);
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    piVar2[lVar3] = -1;
  }
  if (vsFileName == (char *)0x0) {
    vsCode = (char *)0x0;
  }
  else {
    vsCode = LoadFileText(vsFileName);
  }
  if (fsFileName == (char *)0x0) {
    fsCode = (char *)0x0;
  }
  else {
    fsCode = LoadFileText(fsFileName);
  }
  SVar4.id = rlLoadShaderCode(vsCode,fsCode);
  free(vsCode);
  free(fsCode);
  if (SVar4.id != 0) {
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexPosition");
    *piVar2 = iVar1;
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexTexCoord");
    piVar2[1] = iVar1;
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexTexCoord2");
    piVar2[2] = iVar1;
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexNormal");
    piVar2[3] = iVar1;
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexTangent");
    piVar2[4] = iVar1;
    iVar1 = rlGetLocationAttrib(SVar4.id,"vertexColor");
    piVar2[5] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"mvp");
    piVar2[6] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"view");
    piVar2[7] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"projection");
    piVar2[8] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"matNormal");
    piVar2[10] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"colDiffuse");
    piVar2[0xc] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"texture0");
    piVar2[0xf] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"texture1");
    piVar2[0x10] = iVar1;
    iVar1 = rlGetLocationUniform(SVar4.id,"texture2");
    piVar2[0x11] = iVar1;
  }
  SVar4._4_4_ = 0;
  SVar4.locs = piVar2;
  return SVar4;
}

Assistant:

Shader LoadShader(const char *vsFileName, const char *fsFileName)
{
    Shader shader = { 0 };
    shader.locs = (int *)RL_CALLOC(MAX_SHADER_LOCATIONS, sizeof(int));

    // NOTE: All locations must be reseted to -1 (no location)
    for (int i = 0; i < MAX_SHADER_LOCATIONS; i++) shader.locs[i] = -1;

    char *vShaderStr = NULL;
    char *fShaderStr = NULL;

    if (vsFileName != NULL) vShaderStr = LoadFileText(vsFileName);
    if (fsFileName != NULL) fShaderStr = LoadFileText(fsFileName);

    shader.id = rlLoadShaderCode(vShaderStr, fShaderStr);

    if (vShaderStr != NULL) RL_FREE(vShaderStr);
    if (fShaderStr != NULL) RL_FREE(fShaderStr);

    // After shader loading, we TRY to set default location names
    if (shader.id > 0)
    {
        // Default shader attrib locations have been fixed before linking:
        //          vertex position location    = 0
        //          vertex texcoord location    = 1
        //          vertex normal location      = 2
        //          vertex color location       = 3
        //          vertex tangent location     = 4
        //          vertex texcoord2 location   = 5

        // NOTE: If any location is not found, loc point becomes -1

        // Get handles to GLSL input attibute locations
        shader.locs[SHADER_LOC_VERTEX_POSITION] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_POSITION);
        shader.locs[SHADER_LOC_VERTEX_TEXCOORD01] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD);
        shader.locs[SHADER_LOC_VERTEX_TEXCOORD02] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD2);
        shader.locs[SHADER_LOC_VERTEX_NORMAL] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_NORMAL);
        shader.locs[SHADER_LOC_VERTEX_TANGENT] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TANGENT);
        shader.locs[SHADER_LOC_VERTEX_COLOR] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_COLOR);

        // Get handles to GLSL uniform locations (vertex shader)
        shader.locs[SHADER_LOC_MATRIX_MVP] = rlGetLocationUniform(shader.id, "mvp");
        shader.locs[SHADER_LOC_MATRIX_VIEW] = rlGetLocationUniform(shader.id, "view");
        shader.locs[SHADER_LOC_MATRIX_PROJECTION] = rlGetLocationUniform(shader.id, "projection");
        shader.locs[SHADER_LOC_MATRIX_NORMAL] = rlGetLocationUniform(shader.id, "matNormal");

        // Get handles to GLSL uniform locations (fragment shader)
        shader.locs[SHADER_LOC_COLOR_DIFFUSE] = rlGetLocationUniform(shader.id, "colDiffuse");
        shader.locs[SHADER_LOC_MAP_DIFFUSE] = rlGetLocationUniform(shader.id, "texture0");
        shader.locs[SHADER_LOC_MAP_SPECULAR] = rlGetLocationUniform(shader.id, "texture1");
        shader.locs[SHADER_LOC_MAP_NORMAL] = rlGetLocationUniform(shader.id, "texture2");
    }

    return shader;
}